

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

void __thiscall
QAbstractItemView::rowsAboutToBeRemoved
          (QAbstractItemView *this,QModelIndex *parent,int start,int end)

{
  int iVar1;
  QPersistentModelIndex *pQVar2;
  QHash<QWidget_*,_QPersistentModelIndex> *this_00;
  QAbstractItemModel *pQVar3;
  long lVar4;
  QWidget *this_01;
  QObject *pQVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  char cVar8;
  int iVar9;
  ulong uVar10;
  Data<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_> *pDVar11;
  long *plVar12;
  long lVar13;
  int iVar14;
  uint uVar15;
  Data *pDVar16;
  QAbstractItemViewPrivate *d;
  ulong uVar17;
  long in_FS_OFFSET;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  piter it;
  undefined1 local_c8 [8];
  undefined1 auStack_c0 [24];
  QModelIndex local_a8;
  QPersistentModelIndex local_88;
  undefined1 auStack_80 [24];
  void *local_68;
  undefined8 local_60;
  undefined1 local_58 [8];
  undefined1 auStack_50 [24];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = *(long *)(this + 8);
  *(undefined4 *)(lVar4 + 0x3a8) = 5;
  local_a8.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_a8.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  currentIndex(&local_a8,this);
  if (((((*(int *)(lVar4 + 0x338) == 1) && (-1 < local_a8.r)) && (-1 < (long)local_a8._0_8_)) &&
      ((local_a8.r <= end && (start <= local_a8.r)))) &&
     (local_a8.m.ptr != (QAbstractItemModel *)0x0)) {
    if (local_a8.m.ptr == (QAbstractItemModel *)0x0) {
      local_58 = (undefined1  [8])0xffffffffffffffff;
      auStack_50._0_16_ = (undefined1  [16])0x0;
    }
    else {
      (**(code **)(*(long *)local_a8.m.ptr + 0x68))(local_58,local_a8.m.ptr,&local_a8);
    }
    if (((local_58._0_4_ == parent->r) && (local_58._4_4_ == parent->c)) &&
       (((QObject *)auStack_50._0_8_ == (QObject *)parent->i &&
        ((QAbstractItemModel *)auStack_50._8_8_ == (parent->m).ptr)))) {
      iVar9 = (**(code **)(**(long **)(lVar4 + 0x2f8) + 0x78))(*(long **)(lVar4 + 0x2f8),parent);
      if ((end - start) + 1 < iVar9) {
        local_58 = (undefined1  [8])0xffffffffffffffff;
        auStack_50._0_16_ = (undefined1  [16])0x0;
        iVar9 = (**(code **)(**(long **)(lVar4 + 0x2f8) + 0x78))(*(long **)(lVar4 + 0x2f8),parent);
        iVar14 = end + 1;
        if (iVar14 < iVar9) {
          do {
            plVar12 = *(long **)(lVar4 + 0x2f8);
            iVar1 = local_a8.c;
            if (local_a8.m.ptr == (QAbstractItemModel *)0x0) {
              local_c8 = (undefined1  [8])0xffffffffffffffff;
              auStack_c0._0_16_ = (undefined1  [16])0x0;
            }
            else {
              (**(code **)(*(long *)local_a8.m.ptr + 0x68))(local_c8,local_a8.m.ptr,&local_a8);
            }
            (**(code **)(*plVar12 + 0x60))(&local_88,plVar12,iVar14,iVar1,local_c8);
            local_58 = (undefined1  [8])local_88.d;
            auStack_50._0_16_ = auStack_80._0_16_;
            cVar8 = (**(code **)(*(long *)this + 0x2c0))(this,local_58);
            if ((cVar8 == '\0') &&
               (uVar10 = (**(code **)(**(long **)(lVar4 + 0x2f8) + 0x138))
                                   (*(long **)(lVar4 + 0x2f8),local_58), (uVar10 & 0x20) != 0))
            goto LAB_005449aa;
            iVar14 = iVar14 + 1;
          } while (iVar9 != iVar14);
        }
        iVar9 = start;
        if (0 < start) {
          do {
            while( true ) {
              plVar12 = *(long **)(lVar4 + 0x2f8);
              iVar14 = local_a8.c;
              if (local_a8.m.ptr == (QAbstractItemModel *)0x0) {
                local_c8 = (undefined1  [8])0xffffffffffffffff;
                auStack_c0._0_16_ = (undefined1  [16])0x0;
              }
              else {
                (**(code **)(*(long *)local_a8.m.ptr + 0x68))(local_c8,local_a8.m.ptr,&local_a8);
              }
              iVar1 = iVar9 + -1;
              (**(code **)(*plVar12 + 0x60))(&local_88,plVar12,iVar1,iVar14,local_c8);
              local_58 = (undefined1  [8])local_88.d;
              auStack_50._0_16_ = auStack_80._0_16_;
              cVar8 = (**(code **)(*(long *)this + 0x2c0))(this,local_58);
              if (cVar8 != '\0') break;
              uVar10 = (**(code **)(**(long **)(lVar4 + 0x2f8) + 0x138))
                                 (*(long **)(lVar4 + 0x2f8),local_58);
              if (((uVar10 & 0x20) != 0) || (bVar6 = iVar9 < 2, iVar9 = iVar1, bVar6))
              goto LAB_005449aa;
            }
            bVar6 = 1 < iVar9;
            iVar9 = iVar1;
          } while (bVar6);
        }
LAB_005449aa:
        setCurrentIndex(this,(QModelIndex *)local_58);
      }
      else {
        local_58 = *(undefined1 (*) [8])parent;
        auStack_50._0_8_ = parent->i;
        auStack_50._8_8_ = parent->m;
        pQVar2 = (QPersistentModelIndex *)(lVar4 + 0x3b8);
        cVar8 = comparesEqual(pQVar2,(QModelIndex *)local_58);
        if (cVar8 == '\0') {
          do {
            uVar10 = (**(code **)(**(long **)(lVar4 + 0x2f8) + 0x138))
                               (*(long **)(lVar4 + 0x2f8),(QModelIndex *)local_58);
            if ((uVar10 & 0x20) != 0) break;
            if ((QAbstractItemModel *)auStack_50._8_8_ == (QAbstractItemModel *)0x0) {
              local_88.d = (QPersistentModelIndexData *)0xffffffffffffffff;
              auStack_80._0_16_ = (undefined1  [16])0x0;
            }
            else {
              (**(code **)(*(long *)auStack_50._8_8_ + 0x68))
                        (&local_88,auStack_50._8_8_,(QModelIndex *)local_58);
            }
            local_58 = (undefined1  [8])local_88.d;
            auStack_50._0_16_ = auStack_80._0_16_;
            cVar8 = comparesEqual(pQVar2,(QModelIndex *)local_58);
          } while (cVar8 == '\0');
        }
        cVar8 = comparesEqual(pQVar2,(QModelIndex *)local_58);
        if (cVar8 == '\0') {
          setCurrentIndex(this,(QModelIndex *)local_58);
        }
      }
    }
  }
  this_00 = (QHash<QWidget_*,_QPersistentModelIndex> *)(lVar4 + 0x340);
  pDVar11 = *(Data<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_> **)(lVar4 + 0x340);
  if (pDVar11 == (Data<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_> *)0x0) {
LAB_00544a2b:
    pDVar16 = (Data *)0x0;
  }
  else {
    if (1 < (uint)(pDVar11->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      pDVar11 = QHashPrivate::Data<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_>::detached
                          (pDVar11);
      this_00->d = pDVar11;
    }
    pDVar16 = this_00->d;
    if (pDVar16->spans->offsets[0] == 0xff) {
      uVar10 = 1;
      do {
        uVar17 = uVar10;
        if (pDVar16->numBuckets == uVar17) goto LAB_00544a2b;
        uVar10 = uVar17 + 1;
      } while (pDVar16->spans[uVar17 >> 7].offsets[(uint)uVar17 & 0x7f] == 0xff);
      goto LAB_00544a31;
    }
  }
  uVar17 = 0;
LAB_00544a31:
  it.bucket = uVar17;
  it.d = pDVar16;
  if (pDVar16 != (Data *)0x0 || uVar17 != 0) {
    do {
      uVar17 = it.bucket;
      pDVar11 = it.d;
      local_c8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      auStack_c0._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      auStack_c0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      uVar10 = uVar17 >> 7;
      uVar15 = (uint)it.bucket & 0x7f;
      QPersistentModelIndex::operator_cast_to_QModelIndex
                ((QModelIndex *)local_c8,
                 (QPersistentModelIndex *)
                 (pDVar11->spans[uVar10].entries[pDVar11->spans[uVar10].offsets[uVar15]].storage.
                  data + 8));
      local_88.d = (QPersistentModelIndexData *)local_c8;
      auStack_80._0_16_ = auStack_c0._0_16_;
      while( true ) {
        iVar9 = -1;
        if (((int)local_88.d < 0) || ((long)local_88.d < 0)) break;
        lVar13 = 0;
        iVar14 = -1;
        if ((long *)auStack_80._8_8_ == (long *)0x0) goto LAB_00544bd8;
        local_58 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
        auStack_50._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        auStack_50._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        (**(code **)(*(long *)auStack_80._8_8_ + 0x68))(local_58,auStack_80._8_8_,&local_88);
        pQVar3 = (parent->m).ptr;
        auVar19[0] = -((char)pQVar3 == auStack_50[8]);
        auVar19[1] = -((char)((ulong)pQVar3 >> 8) == auStack_50[9]);
        auVar19[2] = -((char)((ulong)pQVar3 >> 0x10) == auStack_50[10]);
        auVar19[3] = -((char)((ulong)pQVar3 >> 0x18) == auStack_50[0xb]);
        auVar19[4] = -((char)((ulong)pQVar3 >> 0x20) == auStack_50[0xc]);
        auVar19[5] = -((char)((ulong)pQVar3 >> 0x28) == auStack_50[0xd]);
        auVar19[6] = -((char)((ulong)pQVar3 >> 0x30) == auStack_50[0xe]);
        auVar19[7] = -((char)((ulong)pQVar3 >> 0x38) == auStack_50[0xf]);
        auVar19[8] = 0xff;
        auVar19[9] = 0xff;
        auVar19[10] = 0xff;
        auVar19[0xb] = 0xff;
        auVar19[0xc] = 0xff;
        auVar19[0xd] = 0xff;
        auVar19[0xe] = 0xff;
        auVar19[0xf] = 0xff;
        auVar18[0] = -((char)parent->r == local_58[0]);
        auVar18[1] = -(*(char *)((long)&parent->r + 1) == local_58[1]);
        auVar18[2] = -(*(char *)((long)&parent->r + 2) == local_58[2]);
        auVar18[3] = -(*(char *)((long)&parent->r + 3) == local_58[3]);
        auVar18[4] = -((char)parent->c == local_58[4]);
        auVar18[5] = -(*(char *)((long)&parent->c + 1) == local_58[5]);
        auVar18[6] = -(*(char *)((long)&parent->c + 2) == local_58[6]);
        auVar18[7] = -(*(char *)((long)&parent->c + 3) == local_58[7]);
        auVar18[8] = -((char)parent->i == auStack_50[0]);
        auVar18[9] = -(*(char *)((long)&parent->i + 1) == auStack_50[1]);
        auVar18[10] = -(*(char *)((long)&parent->i + 2) == auStack_50[2]);
        auVar18[0xb] = -(*(char *)((long)&parent->i + 3) == auStack_50[3]);
        auVar18[0xc] = -(*(char *)((long)&parent->i + 4) == auStack_50[4]);
        auVar18[0xd] = -(*(char *)((long)&parent->i + 5) == auStack_50[5]);
        auVar18[0xe] = -(*(char *)((long)&parent->i + 6) == auStack_50[6]);
        auVar18[0xf] = -(*(char *)((long)&parent->i + 7) == auStack_50[7]);
        auVar18 = auVar18 & auVar19;
        if ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) == 0xffff) {
          lVar13 = auStack_80._8_8_;
          iVar14 = (int)local_88.d;
          iVar9 = local_88.d._4_4_;
          goto LAB_00544bd8;
        }
        local_88.d = (QPersistentModelIndexData *)local_58;
        auStack_80._0_16_ = auStack_50._0_16_;
      }
      lVar13 = 0;
      iVar14 = -1;
LAB_00544bd8:
      if ((((iVar14 < 0) || (iVar9 < 0)) || (end < iVar14)) || ((lVar13 == 0 || (iVar14 < start))))
      {
        do {
          if (pDVar11->numBuckets - 1 == uVar17) {
            it = (piter)ZEXT816(0);
            break;
          }
          uVar17 = uVar17 + 1;
          it.bucket = uVar17;
          it.d = pDVar11;
        } while (pDVar11->spans[uVar17 >> 7].offsets[(uint)uVar17 & 0x7f] == 0xff);
      }
      else {
        this_01 = *(QWidget **)
                   pDVar11->spans[uVar10].entries[pDVar11->spans[uVar10].offsets[uVar15]].storage.
                   data;
        local_58 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
        auStack_50._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        auStack_50._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QPersistentModelIndex::QPersistentModelIndex(&local_88,(QModelIndex *)local_c8);
        QHash<QPersistentModelIndex,_QEditorInfo>::takeImpl<QPersistentModelIndex>
                  ((QEditorInfo *)local_58,
                   (QHash<QPersistentModelIndex,_QEditorInfo> *)(lVar4 + 0x348),&local_88);
        QPersistentModelIndex::~QPersistentModelIndex(&local_88);
        it = (piter)QHash<QWidget_*,_QPersistentModelIndex>::erase(this_00,(const_iterator)it);
        if (((local_58 != (undefined1  [8])0x0) && (*(int *)((long)local_58 + 4) != 0)) &&
           (((QObject *)auStack_50._0_8_ != (QObject *)0x0 && (this_01 != (QWidget *)0x0)))) {
          pQVar5 = *(QObject **)(lVar4 + 8);
          local_88.d = (QPersistentModelIndexData *)QObject::destroyed;
          auVar7._8_8_ = 0;
          auVar7._0_8_ = auStack_80._8_8_;
          auStack_80._0_16_ = auVar7 << 0x40;
          local_68 = (void *)0x2a1;
          local_60 = 0;
          QObject::disconnectImpl
                    (&this_01->super_QObject,&local_88.d,pQVar5,&local_68,
                     (QMetaObject *)&QObject::staticMetaObject);
          QObject::removeEventFilter(&this_01->super_QObject);
          QWidget::hide(this_01);
          plVar12 = (long *)(**(code **)(*(long *)pQVar5 + 0x208))(pQVar5,(QModelIndex *)local_c8);
          if (plVar12 == (long *)0x0) {
            QObject::deleteLater();
          }
          else {
            (**(code **)(*plVar12 + 0x78))(plVar12,this_01,(QModelIndex *)local_c8);
          }
        }
        if (local_58 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)local_58 = *(int *)local_58 + -1;
          UNLOCK();
          if ((*(int *)local_58 == 0) && (local_58 != (undefined1  [8])0x0)) {
            operator_delete((void *)local_58);
          }
        }
      }
    } while ((it.d != (Data<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_> *)0x0) ||
            (it.bucket != 0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::rowsAboutToBeRemoved(const QModelIndex &parent, int start, int end)
{
    Q_D(QAbstractItemView);

    setState(CollapsingState);

    // Ensure one selected item in single selection mode.
    QModelIndex current = currentIndex();
    if (d->selectionMode == SingleSelection
        && current.isValid()
        && current.row() >= start
        && current.row() <= end
        && current.parent() == parent) {
        int totalToRemove = end - start + 1;
        if (d->model->rowCount(parent) <= totalToRemove) { // no more children
            QModelIndex index = parent;
            while (index != d->root && !d->isIndexEnabled(index))
                index = index.parent();
            if (index != d->root)
                setCurrentIndex(index);
        } else {
            int row = end + 1;
            QModelIndex next;
            const int rowCount = d->model->rowCount(parent);
            bool found = false;
            // find the next visible and enabled item
            while (row < rowCount && !found) {
                next = d->model->index(row++, current.column(), current.parent());
#ifdef QT_DEBUG
                if (!next.isValid()) {
                    qWarning("Model unexpectedly returned an invalid index");
                    break;
                }
#endif
                if (!isIndexHidden(next) && d->isIndexEnabled(next)) {
                    found = true;
                    break;
                }
            }

            if (!found) {
                row = start - 1;
                // find the previous visible and enabled item
                while (row >= 0) {
                    next = d->model->index(row--, current.column(), current.parent());
#ifdef QT_DEBUG
                    if (!next.isValid()) {
                        qWarning("Model unexpectedly returned an invalid index");
                        break;
                    }
#endif
                    if (!isIndexHidden(next) && d->isIndexEnabled(next))
                        break;
                }
            }

            setCurrentIndex(next);
        }
    }

    // Remove all affected editors; this is more efficient than waiting for updateGeometries() to clean out editors for invalid indexes
    const auto findDirectChildOf = [](const QModelIndex &parent, QModelIndex child)
    {
        while (child.isValid()) {
            const auto parentIndex = child.parent();
            if (parentIndex == parent)
                return child;
            child = parentIndex;
        }
        return QModelIndex();
    };
    QEditorIndexHash::iterator i = d->editorIndexHash.begin();
    while (i != d->editorIndexHash.end()) {
        const QModelIndex index = i.value();
        const QModelIndex directChild = findDirectChildOf(parent, index);
        if (directChild.isValid() && directChild.row() >= start && directChild.row() <= end) {
            QWidget *editor = i.key();
            QEditorInfo info = d->indexEditorHash.take(index);
            i = d->editorIndexHash.erase(i);
            if (info.widget)
                d->releaseEditor(editor, index);
        } else {
            ++i;
        }
    }
}